

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase *
CreateArrayIndex(ExpressionContext *ctx,SynBase *source,ExprBase *value,
                ArrayView<ArgumentData> arguments)

{
  TypeHandle **ppTVar1;
  Allocator *pAVar2;
  undefined8 uVar3;
  SynIdentifier *pSVar4;
  FunctionData *pFVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  ExprBase *pEVar9;
  undefined4 extraout_var;
  TypeHandle *pTVar10;
  ExprGetAddress *pEVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SynBase *pSVar12;
  VariableData *pVVar13;
  undefined4 extraout_var_05;
  _func_int **pp_Var14;
  ExprGetAddress *pEVar15;
  ExprBase *pEVar16;
  undefined4 extraout_var_07;
  TypeRef *pTVar17;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  TypeBase *pTVar18;
  undefined8 *puVar19;
  TypeError *pTVar20;
  ArgumentData *pAVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  char *msg;
  TypeHandle *pTVar25;
  uint uVar26;
  TypeBase *pTVar27;
  bool bVar28;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  InplaceStr name;
  InplaceStr name_00;
  ExprBase *local_138;
  TypePair typePair;
  SmallArray<ArgumentData,_4U> callArguments;
  VariableHandle *variable;
  undefined4 extraout_var_00;
  undefined4 extraout_var_06;
  undefined4 extraout_var_12;
  
  pAVar21 = arguments.data;
  uVar26 = arguments.count;
  if ((value == (ExprBase *)0x0) || (pEVar9 = value, value->typeID != 8)) {
    pEVar9 = (ExprBase *)0x0;
  }
  bVar28 = true;
  if (pEVar9 != (ExprBase *)0x0) {
    pp_Var14 = pEVar9[1]._vptr_ExprBase;
    if ((pp_Var14 == (_func_int **)0x0) || (*(int *)(pp_Var14 + 1) != 0x1b)) {
      pp_Var14 = (_func_int **)0x0;
    }
    if (uVar26 == 1 && pp_Var14 != (_func_int **)0x0) {
      pEVar9 = anon_unknown.dwarf_9fd58::EvaluateExpression(ctx,source,pAVar21->value);
      if ((pEVar9 == (ExprBase *)0x0) || (pEVar9->typeID != 6)) {
        pEVar9 = (ExprBase *)0x0;
      }
      bVar28 = pEVar9 == (ExprBase *)0x0;
      if (bVar28) {
        msg = "ERROR: expression didn\'t evaluate to a constant number";
        goto LAB_0016003f;
      }
      if ((long)pEVar9[1]._vptr_ExprBase < 0) {
        msg = "ERROR: argument index can\'t be negative";
        goto LAB_0016003f;
      }
      if (pp_Var14[0xc] == (_func_int *)0x0) {
        msg = "ERROR: function argument set is empty";
        goto LAB_0016003f;
      }
      pTVar10 = ((IntrusiveList<TypeHandle> *)(pp_Var14 + 0xc))->head;
      uVar23 = 0;
      pTVar25 = pTVar10;
      if (pTVar10 != (TypeHandle *)0x0) {
        do {
          uVar22 = (int)uVar23 + 1;
          uVar23 = (ulong)uVar22;
          ppTVar1 = &pTVar25->next;
          pTVar25 = *ppTVar1;
        } while (*ppTVar1 != (TypeHandle *)0x0);
        uVar23 = (ulong)uVar22;
      }
      if ((long)uVar23 <= (long)pEVar9[1]._vptr_ExprBase) {
        uVar23 = 0;
        if (pTVar10 != (TypeHandle *)0x0) {
          uVar23 = 0;
          do {
            uVar23 = (ulong)((int)uVar23 + 1);
            pTVar10 = pTVar10->next;
          } while (pTVar10 != (TypeHandle *)0x0);
        }
        anon_unknown.dwarf_9fd58::Stop
                  (ctx,source,"ERROR: function arguemnt set \'%.*s\' has only %d argument(s)",
                   (ulong)(uint)((int)pp_Var14[3] - (int)pp_Var14[2]),pp_Var14[2],uVar23);
      }
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      local_138 = (ExprBase *)CONCAT44(extraout_var,iVar7);
      pTVar18 = ctx->typeTypeID;
      pTVar10 = IntrusiveList<TypeHandle>::operator[]
                          ((IntrusiveList<TypeHandle> *)(pp_Var14 + 0xc),
                           *(uint *)&pEVar9[1]._vptr_ExprBase);
      pTVar27 = pTVar10->type;
      local_138->typeID = 8;
      local_138->source = source;
      local_138->type = pTVar18;
      local_138->next = (ExprBase *)0x0;
      local_138->listed = false;
      local_138->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229580;
      local_138[1]._vptr_ExprBase = (_func_int **)pTVar27;
    }
  }
  if (!bVar28) {
    return local_138;
  }
  pTVar18 = value->type;
  if ((pTVar18 == (TypeBase *)0x0) || (pTVar27 = pTVar18, pTVar18->typeID != 0x12)) {
    pTVar27 = (TypeBase *)0x0;
  }
  if (pTVar27 == (TypeBase *)0x0) {
    pEVar11 = (ExprGetAddress *)value;
    if ((pTVar18 == (TypeBase *)0x0) || (bVar28 = true, pTVar18->typeID != 0x14)) {
      if ((value == (ExprBase *)0x0) || (pEVar9 = value, value->typeID != 0x22)) {
        pEVar9 = (ExprBase *)0x0;
      }
      if (pEVar9 == (ExprBase *)0x0) {
        if ((value == (ExprBase *)0x0) || (pEVar9 = value, value->typeID != 0x16)) {
          pEVar9 = (ExprBase *)0x0;
        }
        if (pEVar9 == (ExprBase *)0x0) {
          if ((pTVar18 == (TypeBase *)0x0) || (bVar28 = true, pTVar18->typeID != 0x12)) {
            bVar28 = AssertValueExpression(ctx,source,value);
            if (bVar28) {
              pSVar12 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
              pVVar13 = anon_unknown.dwarf_9fd58::AllocateTemporary(ctx,pSVar12,value->type);
              pEVar9 = CreateVariableAccess(ctx,pSVar12,pVVar13,false);
              pEVar9 = CreateAssignment(ctx,pSVar12,pEVar9,value);
              iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
              pEVar16 = (ExprBase *)CONCAT44(extraout_var_05,iVar7);
              pTVar18 = ctx->typeVoid;
              iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              pp_Var14 = (_func_int **)CONCAT44(extraout_var_06,iVar7);
              *pp_Var14 = (_func_int *)0x0;
              pp_Var14[1] = (_func_int *)pVVar13;
              pp_Var14[2] = (_func_int *)0x0;
              *(undefined1 *)(pp_Var14 + 3) = 0;
              pEVar16->typeID = 0x1e;
              pEVar16->source = pSVar12;
              pEVar16->type = pTVar18;
              pEVar16->next = (ExprBase *)0x0;
              pEVar16->listed = false;
              pEVar16->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229a58;
              pEVar16[1]._vptr_ExprBase = pp_Var14;
              *(ExprBase **)&pEVar16[1].typeID = pEVar9;
              pEVar9 = CreateVariableAccess(ctx,pSVar12,pVVar13,false);
              pEVar9 = CreateGetAddress(ctx,pSVar12,pEVar9);
              pEVar15 = (ExprGetAddress *)CreateSequence(ctx,source,pEVar16,pEVar9);
              goto LAB_0015f776;
            }
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            local_138 = (ExprBase *)CONCAT44(extraout_var_11,iVar7);
            pTVar18 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
            iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
            puVar19 = (undefined8 *)CONCAT44(extraout_var_12,iVar7);
            pTVar20 = ExpressionContext::GetErrorType(ctx);
            *(undefined4 *)(puVar19 + 1) = 0;
            puVar19[2] = source;
            puVar19[3] = pTVar20;
            bVar28 = false;
            puVar19[4] = 0;
            *(undefined1 *)(puVar19 + 5) = 0;
            *puVar19 = &PTR__ExprError_00229b38;
            puVar19[0xc] = 0;
            puVar19[6] = puVar19 + 8;
            puVar19[7] = 0x400000000;
            local_138->typeID = 0x1b;
            local_138->source = source;
            local_138->type = pTVar18;
            local_138->next = (ExprBase *)0x0;
            local_138->listed = false;
            local_138->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229ef0;
            local_138[1]._vptr_ExprBase = (_func_int **)value;
            *(undefined8 **)&local_138[1].typeID = puVar19;
          }
        }
        else {
          pEVar15 = (ExprGetAddress *)pEVar9[1]._vptr_ExprBase;
LAB_0015f776:
          bVar28 = true;
          value = &pEVar15->super_ExprBase;
        }
      }
      else {
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pTVar17 = ExpressionContext::GetReferenceType(ctx,value->type);
        iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        variable = (VariableHandle *)CONCAT44(extraout_var_02,iVar8);
        pVVar13 = (VariableData *)pEVar9[1]._vptr_ExprBase;
        variable->source = pEVar9->source;
        variable->variable = pVVar13;
        variable->next = (VariableHandle *)0x0;
        variable->listed = false;
        ExprGetAddress::ExprGetAddress
                  ((ExprGetAddress *)CONCAT44(extraout_var_01,iVar7),source,&pTVar17->super_TypeBase
                   ,variable);
        bVar28 = true;
        value = (ExprBase *)CONCAT44(extraout_var_01,iVar7);
      }
    }
  }
  else {
    iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar11 = (ExprGetAddress *)CONCAT44(extraout_var_00,iVar7);
    pTVar18 = (TypeBase *)pTVar27[1]._vptr_TypeBase;
    (pEVar11->super_ExprBase).typeID = 0x16;
    (pEVar11->super_ExprBase).source = source;
    (pEVar11->super_ExprBase).type = pTVar18;
    (pEVar11->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar11->super_ExprBase).listed = false;
    (pEVar11->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229a90;
    pEVar11->variable = (VariableHandle *)value;
    bVar28 = true;
    if ((pTVar18 != (TypeBase *)0x0) && (pTVar18->typeID == 0x14)) {
      value = (ExprBase *)pEVar11;
    }
  }
  if (!bVar28) {
    return local_138;
  }
  pTVar18 = (((ExprGetAddress *)value)->super_ExprBase).type;
  if (((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x12)) &&
     ((pTVar27 = (pEVar11->super_ExprBase).type, pTVar27 == (TypeBase *)0x0 ||
      (pTVar27->typeID != 0x14)))) goto LAB_0015ff59;
  bVar28 = uVar26 != 1;
  if (uVar26 != 0) {
    bVar28 = uVar26 != 1;
    lVar24 = 0;
    do {
      if (*(long *)((long)&pAVar21->name + lVar24) != 0) {
        bVar28 = true;
      }
      lVar24 = lVar24 + 0x30;
    } while ((ulong)uVar26 * 0x30 != lVar24);
  }
  if (uVar26 == 0) {
    typePair.b = (TypeBase *)0x0;
  }
  else {
    typePair.b = pAVar21->type;
  }
  typePair.a = pTVar18;
  if ((bVar28) ||
     (bVar6 = SmallDenseSet<TypePair,_TypePairHasher,_32U>::contains
                        (&ctx->noIndexOperatorForTypePair,&typePair), !bVar6)) {
    pAVar2 = ctx->allocator;
    lVar24 = 0x20;
    do {
      *(undefined8 *)((long)callArguments.little + lVar24 + -0x20) = 0;
      *(undefined1 *)((long)callArguments.little + lVar24 + -0x18) = 0;
      *(undefined8 *)((long)callArguments.little + lVar24 + -0x10) = 0;
      *(undefined8 *)((long)callArguments.little + lVar24 + -8) = 0;
      *(undefined8 *)((long)&callArguments.little[0].source + lVar24) = 0;
      *(undefined8 *)(&callArguments.little[0].isExplicit + lVar24) = 0;
      lVar24 = lVar24 + 0x30;
    } while (lVar24 != 0xe0);
    callArguments.data = callArguments.little;
    callArguments.max = 4;
    callArguments.little[0].source = (((ExprGetAddress *)value)->super_ExprBase).source;
    callArguments.little[0].type = (((ExprGetAddress *)value)->super_ExprBase).type;
    callArguments.count = 1;
    callArguments.little[0].isExplicit = false;
    callArguments.little[0].name = (SynIdentifier *)0x0;
    callArguments.little[0].valueFunction = (FunctionData *)0x0;
    callArguments.little[0].value = value;
    callArguments.allocator = pAVar2;
    if (uVar26 != 0) {
      lVar24 = 0;
      do {
        if (callArguments.count == callArguments.max) {
          SmallArray<ArgumentData,_4U>::grow(&callArguments,callArguments.count);
        }
        if (callArguments.data == (ArgumentData *)0x0) {
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,
                        "void SmallArray<ArgumentData, 4>::push_back(const T &) [T = ArgumentData, N = 4]"
                       );
        }
        puVar19 = (undefined8 *)((long)&pAVar21->source + lVar24);
        uVar23 = (ulong)callArguments.count;
        callArguments.count = callArguments.count + 1;
        pSVar12 = (SynBase *)*puVar19;
        uVar3 = puVar19[1];
        pSVar4 = (SynIdentifier *)puVar19[2];
        pTVar18 = (TypeBase *)puVar19[3];
        pFVar5 = (FunctionData *)puVar19[5];
        callArguments.data[uVar23].value = (ExprBase *)puVar19[4];
        (&callArguments.data[uVar23].value)[1] = (ExprBase *)pFVar5;
        callArguments.data[uVar23].name = pSVar4;
        (&callArguments.data[uVar23].name)[1] = (SynIdentifier *)pTVar18;
        callArguments.data[uVar23].source = pSVar12;
        *(undefined8 *)&callArguments.data[uVar23].isExplicit = uVar3;
        lVar24 = lVar24 + 0x30;
      } while ((ulong)uVar26 * 0x30 != lVar24);
    }
    arguments_00.count = callArguments.count;
    arguments_00.data = callArguments.data;
    arguments_00._12_4_ = 0;
    name.end = "";
    name.begin = "[]";
    pEVar9 = CreateFunctionCallByName(ctx,source,name,arguments_00,true,false,true);
    if (pEVar9 != (ExprBase *)0x0) {
      pTVar18 = pEVar9->type;
      if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x12)) {
        pTVar18 = (TypeBase *)0x0;
      }
      local_138 = pEVar9;
      if (pTVar18 != (TypeBase *)0x0) {
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        local_138 = (ExprBase *)CONCAT44(extraout_var_03,iVar7);
        pTVar18 = (TypeBase *)pTVar18[1]._vptr_TypeBase;
        local_138->typeID = 0x16;
        local_138->source = source;
        local_138->type = pTVar18;
        local_138->next = (ExprBase *)0x0;
        local_138->listed = false;
        local_138->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229a90;
        local_138[1]._vptr_ExprBase = (_func_int **)pEVar9;
      }
    }
    if (pEVar9 == (ExprBase *)0x0) {
      if (callArguments.count == 0) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<ArgumentData, 4>::operator[](unsigned int) [T = ArgumentData, N = 4]"
                     );
      }
      pTVar18 = (pEVar11->super_ExprBase).type;
      (callArguments.data)->source = (pEVar11->super_ExprBase).source;
      (callArguments.data)->isExplicit = false;
      (callArguments.data)->name = (SynIdentifier *)0x0;
      (callArguments.data)->type = pTVar18;
      (callArguments.data)->value = &pEVar11->super_ExprBase;
      (callArguments.data)->valueFunction = (FunctionData *)0x0;
      arguments_01.count = callArguments.count;
      arguments_01.data = callArguments.data;
      arguments_01._12_4_ = 0;
      name_00.end = "";
      name_00.begin = "[]";
      pEVar9 = CreateFunctionCallByName(ctx,source,name_00,arguments_01,(bool)~bVar28,false,true);
      if (pEVar9 != (ExprBase *)0x0) {
        pTVar18 = pEVar9->type;
        if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x12)) {
          pTVar18 = (TypeBase *)0x0;
        }
        local_138 = pEVar9;
        if (pTVar18 != (TypeBase *)0x0) {
          iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          local_138 = (ExprBase *)CONCAT44(extraout_var_04,iVar7);
          pTVar18 = (TypeBase *)pTVar18[1]._vptr_TypeBase;
          local_138->typeID = 0x16;
          local_138->source = source;
          local_138->type = pTVar18;
          local_138->next = (ExprBase *)0x0;
          local_138->listed = false;
          local_138->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229a90;
          local_138[1]._vptr_ExprBase = (_func_int **)pEVar9;
        }
      }
      if (pEVar9 != (ExprBase *)0x0) goto LAB_0015fbea;
      bVar6 = true;
      SmallDenseSet<TypePair,_TypePairHasher,_32U>::insert
                (&ctx->noIndexOperatorForTypePair,&typePair);
    }
    else {
LAB_0015fbea:
      bVar6 = false;
    }
    SmallArray<ArgumentData,_4U>::~SmallArray(&callArguments);
    if (bVar6) goto LAB_0015fc0a;
    bVar28 = false;
  }
  else {
LAB_0015fc0a:
    if (bVar28) {
      msg = "ERROR: overloaded \'[]\' operator is not available";
LAB_0016003f:
      anon_unknown.dwarf_9fd58::Stop(ctx,source,msg);
    }
    if (uVar26 == 0) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x22a,"T &ArrayView<ArgumentData>::operator[](unsigned int) [T = ArgumentData]"
                   );
    }
    pEVar9 = CreateCast(ctx,source,pAVar21->value,ctx->typeInt,false);
    pEVar16 = anon_unknown.dwarf_9fd58::EvaluateExpression(ctx,source,pEVar9);
    if ((pEVar16 == (ExprBase *)0x0) || (pEVar16->typeID != 6)) {
      pEVar16 = (ExprBase *)0x0;
    }
    if ((pEVar16 != (ExprBase *)0x0) && ((long)pEVar16[1]._vptr_ExprBase < 0)) {
      msg = "ERROR: array index cannot be negative";
      goto LAB_0016003f;
    }
    pTVar18 = (pEVar11->super_ExprBase).type;
    if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x13)) {
      pTVar18 = (TypeBase *)0x0;
    }
    if (pTVar18 != (TypeBase *)0x0) {
      if ((pEVar16 != (ExprBase *)0x0) &&
         (lVar24._0_4_ = pTVar18[1].typeID, lVar24._4_4_ = pTVar18[1].nameHash,
         lVar24 <= (long)pEVar16[1]._vptr_ExprBase)) {
        msg = "ERROR: array index out of bounds";
        goto LAB_0016003f;
      }
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pp_Var14 = (_func_int **)CONCAT44(extraout_var_07,iVar7);
      pTVar17 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)pTVar18[1]._vptr_TypeBase);
      *(undefined4 *)(pp_Var14 + 1) = 0x1b;
      pp_Var14[2] = (_func_int *)source;
      pp_Var14[3] = (_func_int *)pTVar17;
      pp_Var14[4] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var14 + 5) = 0;
      *pp_Var14 = (_func_int *)&PTR__ExprBase_00229ef0;
      pp_Var14[6] = (_func_int *)value;
      pp_Var14[7] = (_func_int *)pEVar9;
      iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      local_138 = (ExprBase *)CONCAT44(extraout_var_08,iVar7);
      pTVar27 = (TypeBase *)pTVar18[1]._vptr_TypeBase;
      local_138->typeID = 0x16;
      local_138->source = source;
      local_138->type = pTVar27;
      local_138->next = (ExprBase *)0x0;
      local_138->listed = false;
      local_138->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229a90;
      local_138[1]._vptr_ExprBase = pp_Var14;
    }
    if (pTVar18 == (TypeBase *)0x0) {
      pTVar18 = (pEVar11->super_ExprBase).type;
      if ((pTVar18 == (TypeBase *)0x0) || (pTVar18->typeID != 0x14)) {
        pTVar18 = (TypeBase *)0x0;
      }
      bVar28 = pTVar18 == (TypeBase *)0x0;
      if (!bVar28) {
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pp_Var14 = (_func_int **)CONCAT44(extraout_var_09,iVar7);
        pTVar17 = ExpressionContext::GetReferenceType(ctx,*(TypeBase **)&pTVar18[1].typeIndex);
        *(undefined4 *)(pp_Var14 + 1) = 0x1b;
        pp_Var14[2] = (_func_int *)source;
        pp_Var14[3] = (_func_int *)pTVar17;
        bVar28 = false;
        pp_Var14[4] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var14 + 5) = 0;
        *pp_Var14 = (_func_int *)&PTR__ExprBase_00229ef0;
        pp_Var14[6] = (_func_int *)value;
        pp_Var14[7] = (_func_int *)pEVar9;
        iVar7 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        local_138 = (ExprBase *)CONCAT44(extraout_var_10,iVar7);
        pTVar18 = *(TypeBase **)&pTVar18[1].typeIndex;
        local_138->typeID = 0x16;
        local_138->source = source;
        local_138->type = pTVar18;
        local_138->next = (ExprBase *)0x0;
        local_138->listed = false;
        local_138->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00229a90;
        local_138[1]._vptr_ExprBase = pp_Var14;
      }
    }
    else {
      bVar28 = false;
    }
  }
  if (!bVar28) {
    return local_138;
  }
LAB_0015ff59:
  pTVar18 = (pEVar11->super_ExprBase).type;
  anon_unknown.dwarf_9fd58::Stop
            (ctx,source,"ERROR: type \'%.*s\' is not an array",
             (ulong)(uint)(*(int *)&(pTVar18->name).end - (int)(pTVar18->name).begin));
}

Assistant:

ExprBase* CreateArrayIndex(ExpressionContext &ctx, SynBase *source, ExprBase *value, ArrayView<ArgumentData> arguments)
{
	// Handle argument[x] expresion
	if(ExprTypeLiteral *type = getType<ExprTypeLiteral>(value))
	{
		if(TypeArgumentSet *argumentSet = getType<TypeArgumentSet>(type->value))
		{
			if(arguments.size() == 1)
			{
				if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, source, arguments[0].value)))
				{
					if(number->value < 0)
						Stop(ctx, source, "ERROR: argument index can't be negative");

					if(argumentSet->types.empty())
						Stop(ctx, source, "ERROR: function argument set is empty");

					if(number->value >= argumentSet->types.size())
						Stop(ctx, source, "ERROR: function arguemnt set '%.*s' has only %d argument(s)", FMT_ISTR(argumentSet->name), argumentSet->types.size());

					return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, argumentSet->types[unsigned(number->value)]->type);
				}
				else
				{
					Stop(ctx, source, "ERROR: expression didn't evaluate to a constant number");
				}
			}
		}
	}

	ExprBase* wrapped = value;

	if(TypeRef *refType = getType<TypeRef>(value->type))
	{
		value = new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, value);

		if(isType<TypeUnsizedArray>(value->type))
			wrapped = value;
	}
	else if(isType<TypeUnsizedArray>(value->type))
	{
		wrapped = value; // Do not modify
	}
	else if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
	{
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	}
	else if(ExprDereference *node = getType<ExprDereference>(value))
	{
		wrapped = node->value;
	}
	else if(!isType<TypeRef>(wrapped->type))
	{
		if(!AssertValueExpression(ctx, source, wrapped))
			return new (ctx.get<ExprArrayIndex>()) ExprArrayIndex(source, ctx.GetErrorType(), value, new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType()));

		SynBase *sourceInternal = ctx.MakeInternal(source);

		VariableData *storage = AllocateTemporary(ctx, sourceInternal, wrapped->type);

		ExprBase *assignment = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false), value);

		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

		wrapped = CreateSequence(ctx, source, definition, CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false)));
	}

	if(isType<TypeRef>(wrapped->type) || isType<TypeUnsizedArray>(value->type))
	{
		bool findOverload = arguments.empty() || arguments.size() > 1;

		for(unsigned i = 0; i < arguments.size(); i++)
		{
			if(arguments[i].name)
				findOverload = true;
		}

		TypePair typePair(wrapped->type, arguments.empty() ? NULL : arguments[0].type);

		if(findOverload || !ctx.noIndexOperatorForTypePair.contains(typePair))
		{
			SmallArray<ArgumentData, 4> callArguments(ctx.allocator);
			callArguments.push_back(ArgumentData(wrapped->source, false, NULL, wrapped->type, wrapped));

			for(unsigned i = 0; i < arguments.size(); i++)
				callArguments.push_back(arguments[i]);

			if(ExprBase *result = CreateFunctionCallByName(ctx, source, InplaceStr("[]"), callArguments, true, false, true))
			{
				if(TypeRef *refType = getType<TypeRef>(result->type))
					return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, result);

				return result;
			}

			callArguments[0] = ArgumentData(value->source, false, NULL, value->type, value);

			if(ExprBase *result = CreateFunctionCallByName(ctx, source, InplaceStr("[]"), callArguments, !findOverload, false, true))
			{
				if(TypeRef *refType = getType<TypeRef>(result->type))
					return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, result);

				return result;
			}

			ctx.noIndexOperatorForTypePair.insert(typePair);
		}

		if(findOverload)
			Stop(ctx, source, "ERROR: overloaded '[]' operator is not available");

		ExprBase *index = CreateCast(ctx, source, arguments[0].value, ctx.typeInt, false);

		ExprIntegerLiteral *indexValue = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, source, index));

		if(indexValue && indexValue->value < 0)
			Stop(ctx, source, "ERROR: array index cannot be negative");

		if(TypeArray *type = getType<TypeArray>(value->type))
		{
			if(indexValue && indexValue->value >= type->length)
				Stop(ctx, source, "ERROR: array index out of bounds");

			// Array index only shifts an address, so we are left with a reference to get value from
			ExprArrayIndex *shift = new (ctx.get<ExprArrayIndex>()) ExprArrayIndex(source, ctx.GetReferenceType(type->subType), wrapped, index);

			return new (ctx.get<ExprDereference>()) ExprDereference(source, type->subType, shift);
		}

		if(TypeUnsizedArray *type = getType<TypeUnsizedArray>(value->type))
		{
			// Array index only shifts an address, so we are left with a reference to get value from
			ExprArrayIndex *shift = new (ctx.get<ExprArrayIndex>()) ExprArrayIndex(source, ctx.GetReferenceType(type->subType), wrapped, index);

			return new (ctx.get<ExprDereference>()) ExprDereference(source, type->subType, shift);
		}
	}

	Stop(ctx, source, "ERROR: type '%.*s' is not an array", FMT_ISTR(value->type->name));

	return NULL;
}